

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::BlockSizes_SkipInput_Test::BlockSizes_SkipInput_Test
          (BlockSizes_SkipInput_Test *this)

{
  BlockSizes_SkipInput_Test *this_local;
  
  BlockSizes::BlockSizes(&this->super_BlockSizes);
  (this->super_BlockSizes).super_CodedStreamTest.super_Test._vptr_Test =
       (_func_int **)&PTR__BlockSizes_SkipInput_Test_02a179d0;
  (this->super_BlockSizes).super_WithParamInterface<int>._vptr_WithParamInterface =
       (_func_int **)&DAT_02a17a10;
  return;
}

Assistant:

TEST_P(BlockSizes, SkipInput) {
  int kBlockSizes_case = GetParam();
  memcpy(buffer_, kSkipTestBytes, sizeof(kSkipTestBytes));
  ArrayInputStream input(buffer_, sizeof(buffer_), kBlockSizes_case);

  {
    CodedInputStream coded_input(&input);

    std::string str;
    EXPECT_TRUE(coded_input.ReadString(&str, strlen("<Before skipping>")));
    EXPECT_EQ("<Before skipping>", str);
    EXPECT_TRUE(coded_input.Skip(strlen("<To be skipped>")));
    EXPECT_TRUE(coded_input.ReadString(&str, strlen("<After skipping>")));
    EXPECT_EQ("<After skipping>", str);
  }

  EXPECT_EQ(strlen(kSkipTestBytes), input.ByteCount());
}